

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void emit_eobrun(phuff_entropy_ptr entropy)

{
  int iVar1;
  long in_RDI;
  phuff_entropy_ptr unaff_retaddr;
  int nbits;
  int temp;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int iVar2;
  
  if (*(int *)(in_RDI + 0x6c) != 0) {
    iVar2 = *(int *)(in_RDI + 0x6c);
    iVar1 = ""[iVar2] - 1;
    if (0xe < iVar1) {
      *(undefined4 *)(**(long **)(in_RDI + 0x50) + 0x28) = 0x28;
      (**(code **)**(undefined8 **)(in_RDI + 0x50))(*(undefined8 *)(in_RDI + 0x50));
    }
    emit_symbol((phuff_entropy_ptr)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffec,
                in_stack_ffffffffffffffe8);
    if (iVar1 != 0) {
      emit_bits(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    *(undefined4 *)(in_RDI + 0x6c) = 0;
    emit_buffered_bits((phuff_entropy_ptr)CONCAT44(iVar2,iVar1),
                       (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
    *(undefined4 *)(in_RDI + 0x70) = 0;
  }
  return;
}

Assistant:

LOCAL(void)
emit_eobrun(phuff_entropy_ptr entropy)
{
  register int temp, nbits;

  if (entropy->EOBRUN > 0) {    /* if there is any pending EOBRUN */
    temp = entropy->EOBRUN;
    nbits = JPEG_NBITS_NONZERO(temp) - 1;
    /* safety check: shouldn't happen given limited correction-bit buffer */
    if (nbits > 14)
      ERREXIT(entropy->cinfo, JERR_HUFF_MISSING_CODE);

    emit_symbol(entropy, entropy->ac_tbl_no, nbits << 4);
    if (nbits)
      emit_bits(entropy, entropy->EOBRUN, nbits);

    entropy->EOBRUN = 0;

    /* Emit any buffered correction bits */
    emit_buffered_bits(entropy, entropy->bit_buffer, entropy->BE);
    entropy->BE = 0;
  }
}